

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenAddressFileHash.h
# Opt level: O0

void __thiscall
OpenAddressFileHash<int,_int>::OpenAddressFileHash
          (OpenAddressFileHash<int,_int> *this,ion_dictionary_config_info_t config)

{
  int __oflag;
  char *in_RSI;
  OpenAddressFileHash<int,_int> *this_local;
  
  oafdict_init((ion_dictionary_handler_t *)this);
  Dictionary<int,_int>::open(&this->super_Dictionary<int,_int>,in_RSI,__oflag);
  return;
}

Assistant:

OpenAddressFileHash(
	ion_dictionary_config_info_t config
) {
	oafdict_init(&this->handler);

	this->open(config);
}